

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint _c;
  pointer pMVar6;
  size_t _elemsize;
  void *pvVar7;
  void *pvVar8;
  pointer pMVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t i_1;
  void *pvVar13;
  void *__src;
  int j;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  void *__dest;
  ulong uVar21;
  int j_1;
  ulong uVar22;
  ulong uVar23;
  size_t i;
  ulong uVar24;
  bool bVar25;
  int local_d8;
  int local_d0;
  int local_b4;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar6->dims;
  _elemsize = pMVar6->elemsize;
  pvVar7 = (this->slices).data;
  pvVar8 = (this->indices).data;
  if (uVar2 == 1) {
    uVar2 = pMVar6->w;
    lVar17 = 0;
    lVar16 = 0;
    uVar24 = 0;
    iVar19 = 0;
    while( true ) {
      pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar9) / 0x48;
      if (uVar10 <= uVar24) break;
      if (pvVar8 == (void *)0x0) {
        iVar18 = *(int *)((long)pvVar7 + uVar24 * 4);
        if (iVar18 == -0xe9) {
          iVar18 = (int)((ulong)(long)(int)(uVar2 - iVar19) / (uVar10 + lVar17));
        }
      }
      else if (uVar24 == uVar10 - 1) {
        iVar18 = uVar2 - iVar19;
      }
      else {
        iVar18 = *(int *)((long)pvVar8 + uVar24 * 4);
        iVar18 = (iVar18 - iVar19) + (iVar18 >> 0x1f & uVar2);
      }
      Mat::create((Mat *)((long)&pMVar9->data + lVar16),iVar18,_elemsize,opt->blob_allocator);
      pvVar13 = *(void **)((long)&pMVar9->data + lVar16);
      if ((pvVar13 == (void *)0x0) ||
         ((long)*(int *)((long)&pMVar9->c + lVar16) * *(long *)((long)&pMVar9->cstep + lVar16) == 0)
         ) {
        return -100;
      }
      memcpy(pvVar13,(void *)((long)iVar19 * _elemsize + (long)pMVar6->data),
             (long)iVar18 * _elemsize);
      iVar19 = iVar18 + iVar19;
      uVar24 = uVar24 + 1;
      lVar16 = lVar16 + 0x48;
      lVar17 = lVar17 + -1;
    }
  }
  else {
    iVar19 = (this->axis >> 0x1f & uVar2) + this->axis;
    if ((uVar2 == 2) && (iVar19 == 0)) {
      iVar19 = pMVar6->w;
      uVar2 = pMVar6->h;
      lVar16 = 0;
      lVar17 = 0;
      uVar24 = 0;
      iVar18 = 0;
      while( true ) {
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) / 0x48;
        if (uVar10 <= uVar24) break;
        if (pvVar8 == (void *)0x0) {
          iVar20 = *(int *)((long)pvVar7 + uVar24 * 4);
          if (iVar20 == -0xe9) {
            iVar20 = (int)((ulong)(long)(int)(uVar2 - iVar18) / (uVar10 + lVar16));
          }
        }
        else if (uVar24 == uVar10 - 1) {
          iVar20 = uVar2 - iVar18;
        }
        else {
          iVar20 = *(int *)((long)pvVar8 + uVar24 * 4);
          iVar20 = (iVar20 - iVar18) + (iVar20 >> 0x1f & uVar2);
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar17),iVar19,iVar20,_elemsize,
                    opt->blob_allocator);
        pvVar13 = *(void **)((long)&pMVar9->data + lVar17);
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar17) * *(long *)((long)&pMVar9->cstep + lVar17) ==
            0) {
          return -100;
        }
        memcpy(pvVar13,(void *)((long)iVar18 * (long)pMVar6->w * pMVar6->elemsize +
                               (long)pMVar6->data),(long)(iVar20 * iVar19) * _elemsize);
        iVar18 = iVar20 + iVar18;
        uVar24 = uVar24 + 1;
        lVar17 = lVar17 + 0x48;
        lVar16 = lVar16 + -1;
      }
    }
    else if ((uVar2 == 2) && (iVar19 == 1)) {
      uVar2 = pMVar6->w;
      uVar3 = pMVar6->h;
      uVar24 = 0;
      if (0 < (int)uVar3) {
        uVar24 = (ulong)uVar3;
      }
      uVar10 = 0;
      local_d8 = 0;
      while( true ) {
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) / 0x48;
        if (uVar11 < uVar10 || uVar11 - uVar10 == 0) break;
        if (pvVar8 == (void *)0x0) {
          iVar19 = *(int *)((long)pvVar7 + uVar10 * 4);
          if (iVar19 == -0xe9) {
            iVar19 = (int)((ulong)(long)(int)(uVar2 - local_d8) / (uVar11 - uVar10));
          }
        }
        else if (uVar10 == uVar11 - 1) {
          iVar19 = uVar2 - local_d8;
        }
        else {
          iVar19 = *(int *)((long)pvVar8 + uVar10 * 4);
          iVar19 = (iVar19 - local_d8) + (iVar19 >> 0x1f & uVar2);
        }
        pMVar1 = pMVar9 + uVar10;
        Mat::create(pMVar1,iVar19,uVar3,_elemsize,opt->blob_allocator);
        if (pMVar9[uVar10].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (uVar11 = 0; uVar24 != uVar11; uVar11 = uVar11 + 1) {
          memcpy((void *)((long)pMVar1->w * uVar11 * pMVar1->elemsize + (long)pMVar1->data),
                 (void *)((long)pMVar6->data +
                         (long)local_d8 * _elemsize + (long)pMVar6->w * uVar11 * pMVar6->elemsize),
                 (long)iVar19 * _elemsize);
        }
        local_d8 = iVar19 + local_d8;
        uVar10 = uVar10 + 1;
      }
    }
    else if ((uVar2 - 3 < 2) && (iVar19 == 0)) {
      iVar19 = pMVar6->w;
      iVar18 = pMVar6->h;
      iVar20 = pMVar6->d;
      uVar3 = pMVar6->c;
      lVar17 = 0;
      lVar16 = 0;
      uVar24 = 0;
      iVar15 = 0;
      while( true ) {
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) / 0x48;
        if (uVar10 <= uVar24) break;
        if (pvVar8 == (void *)0x0) {
          iVar14 = *(int *)((long)pvVar7 + uVar24 * 4);
          if (iVar14 == -0xe9) {
            iVar14 = (int)((ulong)(long)(int)(uVar3 - iVar15) / (uVar10 + lVar17));
          }
        }
        else if (uVar24 == uVar10 - 1) {
          iVar14 = uVar3 - iVar15;
        }
        else {
          iVar14 = *(int *)((long)pvVar8 + uVar24 * 4);
          iVar14 = (iVar14 - iVar15) + (iVar14 >> 0x1f & uVar3);
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar16),iVar19,iVar18,iVar20,iVar14,_elemsize,
                    opt->blob_allocator);
        pvVar13 = *(void **)((long)&pMVar9->data + lVar16);
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar16) * *(long *)((long)&pMVar9->cstep + lVar16) ==
            0) {
          return -100;
        }
        *(uint *)((long)&pMVar9->dims + lVar16) = uVar2;
        memcpy(pvVar13,(void *)((long)iVar15 * pMVar6->cstep * pMVar6->elemsize + (long)pMVar6->data
                               ),(long)(iVar14 * (int)pMVar6->cstep) * _elemsize);
        iVar15 = iVar14 + iVar15;
        uVar24 = uVar24 + 1;
        lVar16 = lVar16 + 0x48;
        lVar17 = lVar17 + -1;
      }
    }
    else if (((uVar2 == 3) && (iVar19 == 1)) || ((uVar2 == 4 && (iVar19 == 2)))) {
      iVar19 = pMVar6->w;
      uVar3 = pMVar6->h;
      uVar4 = pMVar6->d;
      uVar5 = pMVar6->c;
      uVar24 = 0;
      if (0 < (int)uVar4) {
        uVar24 = (ulong)uVar4;
      }
      uVar10 = 0;
      if (0 < (int)uVar5) {
        uVar10 = (ulong)uVar5;
      }
      uVar11 = 0;
      local_d0 = 0;
      while( true ) {
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) / 0x48;
        if (uVar12 < uVar11 || uVar12 - uVar11 == 0) break;
        if (pvVar8 == (void *)0x0) {
          iVar18 = *(int *)((long)pvVar7 + uVar11 * 4);
          if (iVar18 == -0xe9) {
            iVar18 = (int)((ulong)(long)(int)(uVar3 - local_d0) / (uVar12 - uVar11));
          }
        }
        else if (uVar11 == uVar12 - 1) {
          iVar18 = uVar3 - local_d0;
        }
        else {
          iVar18 = *(int *)((long)pvVar8 + uVar11 * 4);
          iVar18 = (iVar18 - local_d0) + (iVar18 >> 0x1f & uVar3);
        }
        pMVar1 = pMVar9 + uVar11;
        Mat::create(pMVar1,iVar19,iVar18,uVar4,uVar5,_elemsize,opt->blob_allocator);
        if (pMVar9[uVar11].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        pMVar1->dims = uVar2;
        for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
          for (uVar22 = 0; uVar24 != uVar22; uVar22 = uVar22 + 1) {
            lVar16 = (long)pMVar6->w * pMVar6->elemsize;
            memcpy((void *)((long)pMVar1->data +
                           (long)pMVar1->h * pMVar1->elemsize * (long)pMVar1->w * uVar22 +
                           pMVar1->cstep * uVar12 * pMVar1->elemsize),
                   (void *)((long)pMVar6->data +
                           lVar16 * local_d0 + (long)pMVar6->h * uVar22 * lVar16 +
                           pMVar6->cstep * uVar12 * pMVar6->elemsize),
                   (long)(iVar18 * iVar19) * _elemsize);
          }
        }
        local_d0 = iVar18 + local_d0;
        uVar11 = uVar11 + 1;
      }
    }
    else if ((uVar2 == 3 && iVar19 == 2) || (iVar19 == 3 && uVar2 == 4)) {
      uVar3 = pMVar6->w;
      uVar4 = pMVar6->h;
      uVar5 = pMVar6->d;
      _c = pMVar6->c;
      uVar24 = 0;
      if (0 < (int)uVar4) {
        uVar24 = (ulong)uVar4;
      }
      uVar10 = 0;
      if (0 < (int)uVar5) {
        uVar10 = (ulong)uVar5;
      }
      uVar11 = 0;
      if (0 < (int)_c) {
        uVar11 = (ulong)_c;
      }
      local_b4 = 0;
      uVar12 = 0;
      while( true ) {
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar22 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) / 0x48;
        if (uVar22 < uVar12 || uVar22 - uVar12 == 0) break;
        if (pvVar8 == (void *)0x0) {
          iVar19 = *(int *)((long)pvVar7 + uVar12 * 4);
          if (iVar19 == -0xe9) {
            iVar19 = (int)((ulong)(long)(int)(uVar3 - local_b4) / (uVar22 - uVar12));
          }
        }
        else if (uVar12 == uVar22 - 1) {
          iVar19 = uVar3 - local_b4;
        }
        else {
          iVar19 = *(int *)((long)pvVar8 + uVar12 * 4);
          iVar19 = (iVar19 - local_b4) + (iVar19 >> 0x1f & uVar3);
        }
        pMVar1 = pMVar9 + uVar12;
        Mat::create(pMVar1,iVar19,uVar4,uVar5,_c,_elemsize,opt->blob_allocator);
        if (pMVar9[uVar12].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        pMVar1->dims = uVar2;
        for (uVar22 = 0; uVar22 != uVar11; uVar22 = uVar22 + 1) {
          __dest = (void *)(pMVar1->cstep * uVar22 * pMVar1->elemsize + (long)pMVar1->data);
          iVar18 = pMVar6->h;
          pvVar13 = (void *)((long)pMVar6->data +
                            pMVar6->cstep * pMVar6->elemsize * uVar22 + (long)local_b4 * _elemsize);
          lVar16 = (long)pMVar6->w * pMVar6->elemsize;
          for (uVar23 = 0; __src = pvVar13, uVar21 = uVar24, uVar23 != uVar10; uVar23 = uVar23 + 1)
          {
            while (bVar25 = uVar21 != 0, uVar21 = uVar21 - 1, bVar25) {
              memcpy(__dest,__src,(long)iVar19 * _elemsize);
              __dest = (void *)((long)__dest + (long)iVar19 * _elemsize);
              __src = (void *)((long)__src + lVar16);
            }
            pvVar13 = (void *)((long)pvVar13 + iVar18 * lVar16);
          }
        }
        local_b4 = iVar19 + local_b4;
        uVar12 = uVar12 + 1;
      }
    }
    else {
      if (uVar2 != 4) {
        return 0;
      }
      if (iVar19 != 1) {
        return 0;
      }
      iVar19 = pMVar6->w;
      iVar18 = pMVar6->h;
      uVar2 = pMVar6->d;
      uVar3 = pMVar6->c;
      uVar24 = 0;
      if (0 < (int)uVar3) {
        uVar24 = (ulong)uVar3;
      }
      local_d8 = 0;
      uVar10 = 0;
      while( true ) {
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) / 0x48;
        if (uVar11 < uVar10 || uVar11 - uVar10 == 0) break;
        if (pvVar8 == (void *)0x0) {
          iVar20 = *(int *)((long)pvVar7 + uVar10 * 4);
          if (iVar20 == -0xe9) {
            iVar20 = (int)((ulong)(long)(int)(uVar2 - local_d8) / (uVar11 - uVar10));
          }
        }
        else if (uVar10 == uVar11 - 1) {
          iVar20 = uVar2 - local_d8;
        }
        else {
          iVar20 = *(int *)((long)pvVar8 + uVar10 * 4);
          iVar20 = (iVar20 - local_d8) + (iVar20 >> 0x1f & uVar2);
        }
        pMVar1 = pMVar9 + uVar10;
        Mat::create(pMVar1,iVar19,iVar18,iVar20,uVar3,_elemsize,opt->blob_allocator);
        if (pMVar9[uVar10].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (uVar11 = 0; uVar24 != uVar11; uVar11 = uVar11 + 1) {
          memcpy((void *)(pMVar1->cstep * uVar11 * pMVar1->elemsize + (long)pMVar1->data),
                 (void *)((long)pMVar6->data +
                         (long)pMVar6->h * pMVar6->elemsize * (long)pMVar6->w * (long)local_d8 +
                         pMVar6->cstep * uVar11 * pMVar6->elemsize),
                 (long)(iVar18 * iVar19 * iVar20) * _elemsize);
        }
        local_d8 = iVar20 + local_d8;
        uVar10 = uVar10 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    const int* indices_ptr = indices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = w - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? w + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((w - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = h - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? h + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((h - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = w - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? w + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((w - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = channels - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? channels + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = h - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? h + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((h - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                for (int j = 0; j < d; j++)
                {
                    int size = w * slice;

                    unsigned char* outptr = top_blob.channel(p).depth(j);
                    const unsigned char* ptr = bottom_blob.channel(p).depth(j).row<const unsigned char>(q);
                    memcpy(outptr, ptr, size * elemsize);
                }
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = w - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? w + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((w - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < d; j++)
                {
                    for (int k = 0; k < h; k++)
                    {
                        const unsigned char* ptr = m.depth(j).row<const unsigned char>(k) + q * elemsize;
                        memcpy(outptr, ptr, slice * elemsize);

                        outptr += slice * elemsize;
                    }
                }
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = d - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? d + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((d - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * h * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).depth(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}